

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

ReservedRange * __thiscall
google::protobuf::EnumDescriptor::FindReservedRangeContainingNumber(EnumDescriptor *this,int number)

{
  Nonnull<const_char_*> pcVar1;
  long v1;
  
  if (0 < this->reserved_range_count_) {
    v1 = 0;
    do {
      if (this->reserved_ranges_[v1].start <= number) {
        if (v1 < this->reserved_range_count_) {
          pcVar1 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (v1,(long)this->reserved_range_count_,"index < reserved_range_count()")
          ;
        }
        if (pcVar1 != (Nonnull<const_char_*>)0x0) {
          FindReservedRangeContainingNumber();
LAB_00f11f15:
          FindReservedRangeContainingNumber();
        }
        if (number <= this->reserved_ranges_[v1].end) {
          if ((int)v1 < this->reserved_range_count_) {
            pcVar1 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               (v1,(long)this->reserved_range_count_,
                                "index < reserved_range_count()");
          }
          if (pcVar1 == (Nonnull<const_char_*>)0x0) {
            return this->reserved_ranges_ + v1;
          }
          goto LAB_00f11f15;
        }
      }
      v1 = v1 + 1;
    } while (v1 < this->reserved_range_count_);
  }
  return (ReservedRange *)0x0;
}

Assistant:

const EnumDescriptor::ReservedRange*
EnumDescriptor::FindReservedRangeContainingNumber(int number) const {
  // TODO: Consider a non-linear search.
  for (int i = 0; i < reserved_range_count(); i++) {
    if (number >= reserved_range(i)->start &&
        number <= reserved_range(i)->end) {
      return reserved_range(i);
    }
  }
  return nullptr;
}